

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

string * __thiscall
flatbuffers::Parser::ConformTo_abi_cxx11_(string *__return_storage_ptr__,Parser *this,Parser *base)

{
  StructDef *name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDef *__k;
  size_t sVar2;
  StructDef *pSVar3;
  StructDef *pSVar4;
  EnumDef *pEVar5;
  EnumDef *pEVar6;
  key_type *__k_00;
  key_type *pkVar7;
  _Base_ptr p_Var8;
  long lVar9;
  key_type *__k_01;
  bool bVar10;
  FieldDef *pFVar11;
  int iVar12;
  const_iterator cVar13;
  const_iterator cVar14;
  long *plVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  const_iterator cVar18;
  const_iterator cVar19;
  pointer ppSVar20;
  size_type *psVar21;
  long *plVar22;
  _Base_ptr p_Var23;
  char *pcVar24;
  _Base_ptr p_Var25;
  _Base_ptr p_Var26;
  pointer ppFVar27;
  _Base_ptr p_Var28;
  string qualified_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> qualified_field_name;
  FieldDef *field_base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  set<flatbuffers::FieldDef_*,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
  renamed_fields;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Parser *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  FieldDef *local_100;
  Parser *local_f8;
  _Base_ptr local_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  SymbolTable<flatbuffers::EnumDef> *local_c8;
  undefined1 local_c0 [32];
  _Base_ptr local_a0;
  size_t local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  _Base_ptr local_68;
  SymbolTable<flatbuffers::StructDef> *local_60;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppSVar20 = (this->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_110 = this;
  local_f8 = base;
  if (ppSVar20 !=
      (this->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_60 = &base->structs_;
    local_68 = &(base->structs_).dict._M_t._M_impl.super__Rb_tree_header._M_header;
    local_90 = &__return_storage_ptr__->field_2;
    do {
      name = *ppSVar20;
      local_58 = ppSVar20;
      Namespace::GetFullyQualifiedName
                (&local_170,(name->super_Definition).defined_namespace,(string *)name,1000);
      cVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                       *)local_60,&local_170);
      bVar10 = false;
      if ((cVar13._M_node != local_68) &&
         (paVar1 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     **)(cVar13._M_node + 2),
         paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0)) {
        *(int *)((long)paVar1 + 0xb8) = *(int *)((long)paVar1 + 0xb8) + 1;
        local_c0._8_4_ = _S_red;
        local_c0._16_8_ = (_Base_ptr)0x0;
        local_c0._24_8_ = local_c0 + 8;
        local_98 = 0;
        ppFVar27 = (name->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_108 = paVar1;
        local_a0 = (_Base_ptr)local_c0._24_8_;
        if (ppFVar27 !=
            (name->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_c8 = (SymbolTable<flatbuffers::EnumDef> *)((long)paVar1 + 200);
          local_f0 = (_Base_ptr)(paVar1 + 0xd);
          do {
            __k = *ppFVar27;
            cVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                             *)local_c8,(key_type *)__k);
            if (cVar14._M_node == local_f0) {
              local_100 = (FieldDef *)0x0;
            }
            else {
              local_100 = *(FieldDef **)(cVar14._M_node + 2);
            }
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_150,local_170._M_dataplus._M_p,
                       local_170._M_dataplus._M_p + local_170._M_string_length);
            std::__cxx11::string::append((char *)&local_150);
            plVar15 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_150,
                                         (ulong)(__k->super_Definition).name._M_dataplus._M_p);
            psVar21 = (size_type *)(plVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar21) {
              local_130.field_2._M_allocated_capacity = *psVar21;
              local_130.field_2._8_8_ = plVar15[3];
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            }
            else {
              local_130.field_2._M_allocated_capacity = *psVar21;
              local_130._M_dataplus._M_p = (pointer)*plVar15;
            }
            local_130._M_string_length = plVar15[1];
            *plVar15 = (long)psVar21;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            pFVar11 = local_100;
            if (local_100 == (FieldDef *)0x0) {
              plVar15 = *(long **)((long)local_108 + 0xf8);
              bVar10 = true;
              if (plVar15 != (long *)local_108[0x10]._M_allocated_capacity) {
                do {
                  local_100 = (FieldDef *)*plVar15;
                  if ((__k->value).offset == (local_100->value).offset) {
                    std::
                    _Rb_tree<flatbuffers::FieldDef*,flatbuffers::FieldDef*,std::_Identity<flatbuffers::FieldDef*>,std::less<flatbuffers::FieldDef*>,std::allocator<flatbuffers::FieldDef*>>
                    ::_M_insert_unique<flatbuffers::FieldDef*const&>
                              ((_Rb_tree<flatbuffers::FieldDef*,flatbuffers::FieldDef*,std::_Identity<flatbuffers::FieldDef*>,std::less<flatbuffers::FieldDef*>,std::allocator<flatbuffers::FieldDef*>>
                                *)local_c0,&local_100);
                    pFVar11 = local_100;
                    if (((__k->value).type.base_type == (local_100->value).type.base_type) &&
                       ((__k->value).type.element == (local_100->value).type.element)) {
                      pSVar3 = (__k->value).type.struct_def;
                      pSVar4 = (local_100->value).type.struct_def;
                      if ((pSVar3 == pSVar4) ||
                         (((pSVar4 != (StructDef *)0x0 && pSVar3 != (StructDef *)0x0 &&
                           (sVar2 = (pSVar3->super_Definition).name._M_string_length,
                           sVar2 == (pSVar4->super_Definition).name._M_string_length)) &&
                          ((sVar2 == 0 ||
                           (iVar12 = bcmp((pSVar3->super_Definition).name._M_dataplus._M_p,
                                          (pSVar4->super_Definition).name._M_dataplus._M_p,sVar2),
                           iVar12 == 0)))))) {
                        pEVar5 = (__k->value).type.enum_def;
                        pEVar6 = (pFVar11->value).type.enum_def;
                        if ((pEVar5 == pEVar6) ||
                           (((pEVar6 != (EnumDef *)0x0 && pEVar5 != (EnumDef *)0x0 &&
                             (sVar2 = (pEVar5->super_Definition).name._M_string_length,
                             sVar2 == (pEVar6->super_Definition).name._M_string_length)) &&
                            ((sVar2 == 0 ||
                             (iVar12 = bcmp((pEVar5->super_Definition).name._M_dataplus._M_p,
                                            (pEVar6->super_Definition).name._M_dataplus._M_p,sVar2),
                             iVar12 == 0)))))) break;
                      }
                    }
                    local_e8 = &local_d8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_e8,local_170._M_dataplus._M_p,
                               local_170._M_dataplus._M_p + local_170._M_string_length);
                    std::__cxx11::string::append((char *)&local_e8);
                    plVar15 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_e8,
                                                 (ulong)(local_100->super_Definition).name.
                                                        _M_dataplus._M_p);
                    psVar21 = (size_type *)(plVar15 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar15 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar21) {
                      local_150.field_2._M_allocated_capacity = *psVar21;
                      local_150.field_2._8_8_ = plVar15[3];
                      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                    }
                    else {
                      local_150.field_2._M_allocated_capacity = *psVar21;
                      local_150._M_dataplus._M_p = (pointer)*plVar15;
                    }
                    local_150._M_string_length = plVar15[1];
                    *plVar15 = (long)psVar21;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    if (local_e8 != &local_d8) {
                      operator_delete(local_e8,local_d8 + 1);
                    }
                    std::operator+(&local_50,"field renamed to different type: ",&local_130);
                    plVar15 = (long *)std::__cxx11::string::append((char *)&local_50);
                    plVar22 = plVar15 + 2;
                    if ((long *)*plVar15 == plVar22) {
                      local_78 = *plVar22;
                      lStack_70 = plVar15[3];
                      local_88 = &local_78;
                    }
                    else {
                      local_78 = *plVar22;
                      local_88 = (long *)*plVar15;
                    }
                    local_80 = plVar15[1];
                    *plVar15 = (long)plVar22;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    plVar15 = (long *)std::__cxx11::string::_M_append
                                                ((char *)&local_88,(ulong)local_150._M_dataplus._M_p
                                                );
                    plVar22 = plVar15 + 2;
                    if ((long *)*plVar15 == plVar22) {
                      local_d8 = *plVar22;
                      lStack_d0 = plVar15[3];
                      local_e8 = &local_d8;
                    }
                    else {
                      local_d8 = *plVar22;
                      local_e8 = (long *)*plVar15;
                    }
                    local_e0 = plVar15[1];
                    *plVar15 = (long)plVar22;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    plVar15 = (long *)std::__cxx11::string::append((char *)&local_e8);
                    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_90;
                    psVar21 = (size_type *)(plVar15 + 2);
                    if ((size_type *)*plVar15 == psVar21) {
                      lVar9 = plVar15[3];
                      local_90->_M_allocated_capacity = *psVar21;
                      *(long *)((long)local_90 + 8) = lVar9;
                    }
                    else {
                      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar15;
                      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar21;
                    }
                    __return_storage_ptr__->_M_string_length = plVar15[1];
                    *plVar15 = (long)psVar21;
                    plVar15[1] = 0;
                    *(undefined1 *)(plVar15 + 2) = 0;
                    if (local_e8 != &local_d8) {
                      operator_delete(local_e8,local_d8 + 1);
                    }
                    if (local_88 != &local_78) {
                      operator_delete(local_88,local_78 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_150._M_dataplus._M_p != &local_150.field_2) {
                      operator_delete(local_150._M_dataplus._M_p,
                                      local_150.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_00126193;
                  }
                  plVar15 = plVar15 + 1;
                } while (plVar15 != (long *)local_108[0x10]._M_allocated_capacity);
              }
            }
            else {
              pcVar24 = "offsets differ for field: ";
              if ((__k->value).offset == (local_100->value).offset) {
                sVar2 = (__k->value).constant._M_string_length;
                pcVar24 = "defaults differ for field: ";
                if (sVar2 == (local_100->value).constant._M_string_length) {
                  if (sVar2 != 0) {
                    iVar12 = bcmp((__k->value).constant._M_dataplus._M_p,
                                  (local_100->value).constant._M_dataplus._M_p,sVar2);
                    pcVar24 = "defaults differ for field: ";
                    if (iVar12 != 0) goto LAB_00126185;
                  }
                  pcVar24 = "types differ for field: ";
                  if (((__k->value).type.base_type == (pFVar11->value).type.base_type) &&
                     (pcVar24 = "types differ for field: ",
                     (__k->value).type.element == (pFVar11->value).type.element)) {
                    pSVar3 = (__k->value).type.struct_def;
                    pSVar4 = (pFVar11->value).type.struct_def;
                    if (pSVar3 == pSVar4) goto LAB_00126114;
                    pcVar24 = "types differ for field: ";
                    if (pSVar4 != (StructDef *)0x0 && pSVar3 != (StructDef *)0x0) {
                      sVar2 = (pSVar3->super_Definition).name._M_string_length;
                      pcVar24 = "types differ for field: ";
                      if (sVar2 == (pSVar4->super_Definition).name._M_string_length) {
                        if (sVar2 != 0) {
                          iVar12 = bcmp((pSVar3->super_Definition).name._M_dataplus._M_p,
                                        (pSVar4->super_Definition).name._M_dataplus._M_p,sVar2);
                          pcVar24 = "types differ for field: ";
                          if (iVar12 != 0) goto LAB_00126185;
                        }
LAB_00126114:
                        pEVar5 = (__k->value).type.enum_def;
                        pEVar6 = (pFVar11->value).type.enum_def;
                        if (pEVar5 == pEVar6) goto LAB_0012616c;
                        pcVar24 = "types differ for field: ";
                        if (pEVar6 != (EnumDef *)0x0 && pEVar5 != (EnumDef *)0x0) {
                          sVar2 = (pEVar5->super_Definition).name._M_string_length;
                          pcVar24 = "types differ for field: ";
                          if (sVar2 == (pEVar6->super_Definition).name._M_string_length) {
                            if (sVar2 != 0) {
                              iVar12 = bcmp((pEVar5->super_Definition).name._M_dataplus._M_p,
                                            (pEVar6->super_Definition).name._M_dataplus._M_p,sVar2);
                              pcVar24 = "types differ for field: ";
                              if (iVar12 != 0) goto LAB_00126185;
                            }
LAB_0012616c:
                            bVar10 = true;
                            pcVar24 = "offset types differ for field: ";
                            if (__k->offset64 == pFVar11->offset64) goto LAB_00126195;
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_00126185:
              std::operator+(__return_storage_ptr__,pcVar24,&local_130);
LAB_00126193:
              bVar10 = false;
            }
LAB_00126195:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if (!bVar10) {
              bVar10 = true;
              this = local_110;
              goto LAB_0012672c;
            }
            ppFVar27 = ppFVar27 + 1;
          } while (ppFVar27 !=
                   (name->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        puVar17 = *(undefined8 **)((long)local_108 + 0xf8);
        puVar16 = (undefined8 *)local_108[0x10]._M_allocated_capacity;
        bVar10 = false;
        this = local_110;
        if (puVar17 != puVar16) {
          do {
            __k_00 = (key_type *)*puVar17;
            if ((_Base_ptr)local_c0._16_8_ == (_Base_ptr)0x0) {
LAB_001265d9:
              cVar14 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                               *)&name->fields,__k_00);
              if (((_Rb_tree_header *)cVar14._M_node ==
                   &(name->fields).dict._M_t._M_impl.super__Rb_tree_header) ||
                 (*(long *)(cVar14._M_node + 2) == 0)) {
                std::operator+(&local_150,"field deleted: ",&local_170);
                plVar15 = (long *)std::__cxx11::string::append((char *)&local_150);
                psVar21 = (size_type *)(plVar15 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar15 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar21) {
                  local_130.field_2._M_allocated_capacity = *psVar21;
                  local_130.field_2._8_8_ = plVar15[3];
                  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                }
                else {
                  local_130.field_2._M_allocated_capacity = *psVar21;
                  local_130._M_dataplus._M_p = (pointer)*plVar15;
                }
                local_130._M_string_length = plVar15[1];
                *plVar15 = (long)psVar21;
                plVar15[1] = 0;
                *(undefined1 *)(plVar15 + 2) = 0;
                puVar17 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_130,(ulong)(__k_00->_M_dataplus)._M_p);
                this = local_110;
                (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_90;
                psVar21 = puVar17 + 2;
                if ((size_type *)*puVar17 == psVar21) {
                  lVar9 = puVar17[3];
                  local_90->_M_allocated_capacity = *psVar21;
                  *(long *)((long)local_90 + 8) = lVar9;
                }
                else {
                  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar17;
                  (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar21;
                }
                __return_storage_ptr__->_M_string_length = puVar17[1];
                *puVar17 = psVar21;
                puVar17[1] = 0;
                *(undefined1 *)(puVar17 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p,
                                  local_150.field_2._M_allocated_capacity + 1);
                }
                bVar10 = true;
                break;
              }
              puVar16 = (undefined8 *)local_108[0x10]._M_allocated_capacity;
            }
            else {
              p_Var8 = (_Base_ptr)local_c0._16_8_;
              p_Var26 = (_Base_ptr)(local_c0 + 8);
              do {
                p_Var25 = p_Var26;
                p_Var23 = p_Var8;
                pkVar7 = *(key_type **)(p_Var23 + 1);
                p_Var26 = p_Var23;
                if (pkVar7 < __k_00) {
                  p_Var26 = p_Var25;
                }
                p_Var8 = (&p_Var23->_M_left)[pkVar7 < __k_00];
              } while ((&p_Var23->_M_left)[pkVar7 < __k_00] != (_Base_ptr)0x0);
              if (p_Var26 == (_Base_ptr)(local_c0 + 8)) goto LAB_001265d9;
              if (pkVar7 < __k_00) {
                p_Var23 = p_Var25;
              }
              if (__k_00 < *(key_type **)(p_Var23 + 1)) goto LAB_001265d9;
            }
            puVar17 = puVar17 + 1;
            this = local_110;
          } while (puVar17 != puVar16);
        }
LAB_0012672c:
        std::
        _Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
        ::~_Rb_tree((_Rb_tree<flatbuffers::FieldDef_*,_flatbuffers::FieldDef_*,_std::_Identity<flatbuffers::FieldDef_*>,_std::less<flatbuffers::FieldDef_*>,_std::allocator<flatbuffers::FieldDef_*>_>
                     *)local_c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if (bVar10) {
        return __return_storage_ptr__;
      }
      ppSVar20 = local_58 + 1;
    } while (ppSVar20 !=
             (this->structs_).vec.
             super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var28 = (_Base_ptr)
            (this->enums_).vec.
            super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (p_Var28 !=
      (_Base_ptr)
      (this->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_c8 = &local_f8->enums_;
    local_f8 = (Parser *)&(local_f8->enums_).dict._M_t._M_impl.super__Rb_tree_header;
    local_108 = &__return_storage_ptr__->field_2;
    do {
      p_Var8 = *(_Base_ptr *)p_Var28;
      Namespace::GetFullyQualifiedName
                ((string *)local_c0,(Namespace *)p_Var8[5]._M_parent,(string *)p_Var8,1000);
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
                       *)local_c8,(string *)local_c0);
      bVar10 = false;
      if (((Parser *)cVar18._M_node != local_f8) &&
         (lVar9 = *(long *)(cVar18._M_node + 2), lVar9 != 0)) {
        p_Var26 = *(_Base_ptr *)(p_Var8 + 9);
        local_f0 = p_Var28;
        if (p_Var26 != p_Var8[9]._M_parent) {
          do {
            __k_01 = *(key_type **)p_Var26;
            cVar19 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                             *)(lVar9 + 0xf0),__k_01);
            if (((cVar19._M_node != (_Base_ptr)(lVar9 + 0xf8)) &&
                (*(long *)(cVar19._M_node + 2) != 0)) &&
               (__k_01[5]._M_dataplus._M_p != *(pointer *)(*(long *)(cVar19._M_node + 2) + 0xa0))) {
              bVar10 = true;
              std::operator+(__return_storage_ptr__,"values differ for enum: ",__k_01);
              p_Var28 = local_f0;
              this = local_110;
              goto LAB_00126a03;
            }
            p_Var26 = (_Base_ptr)&p_Var26->_M_parent;
          } while (p_Var26 != p_Var8[9]._M_parent);
        }
        p_Var28 = local_f0;
        this = local_110;
        bVar10 = false;
        if (*(int *)(lVar9 + 0xd0) != *(int *)&p_Var8[6]._M_left) {
          pcVar24 = "enum: ";
          if ((ulong)*(byte *)&p_Var8[6]._M_parent != 0) {
            pcVar24 = "union: ";
          }
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,pcVar24,pcVar24 + (ulong)*(byte *)&p_Var8[6]._M_parent + 6
                    );
          plVar15 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x1b28d5);
          psVar21 = (size_type *)(plVar15 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar21) {
            local_170.field_2._M_allocated_capacity = *psVar21;
            local_170.field_2._8_8_ = plVar15[3];
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          }
          else {
            local_170.field_2._M_allocated_capacity = *psVar21;
            local_170._M_dataplus._M_p = (pointer)*plVar15;
          }
          local_170._M_string_length = plVar15[1];
          *plVar15 = (long)psVar21;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_170,local_c0._0_8_);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_108;
          psVar21 = (size_type *)(plVar15 + 2);
          if ((size_type *)*plVar15 == psVar21) {
            lVar9 = plVar15[3];
            local_108->_M_allocated_capacity = *psVar21;
            *(long *)((long)local_108 + 8) = lVar9;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar15;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar21;
          }
          __return_storage_ptr__->_M_string_length = plVar15[1];
          *plVar15 = (long)psVar21;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          bVar10 = true;
        }
      }
LAB_00126a03:
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
      }
      if (bVar10) {
        return __return_storage_ptr__;
      }
      p_Var28 = (_Base_ptr)&p_Var28->_M_parent;
    } while (p_Var28 !=
             (_Base_ptr)
             (this->enums_).vec.
             super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::ConformTo(const Parser &base) {
  for (auto sit = structs_.vec.begin(); sit != structs_.vec.end(); ++sit) {
    auto &struct_def = **sit;
    auto qualified_name =
        struct_def.defined_namespace->GetFullyQualifiedName(struct_def.name);
    auto struct_def_base = base.LookupStruct(qualified_name);
    if (!struct_def_base) continue;
    std::set<FieldDef *> renamed_fields;
    for (auto fit = struct_def.fields.vec.begin();
         fit != struct_def.fields.vec.end(); ++fit) {
      auto &field = **fit;
      auto field_base = struct_def_base->fields.Lookup(field.name);
      const auto qualified_field_name = qualified_name + "." + field.name;
      if (field_base) {
        if (field.value.offset != field_base->value.offset) {
          return "offsets differ for field: " + qualified_field_name;
        }
        if (field.value.constant != field_base->value.constant) {
          return "defaults differ for field: " + qualified_field_name;
        }
        if (!EqualByName(field.value.type, field_base->value.type)) {
          return "types differ for field: " + qualified_field_name;
        }
        if (field.offset64 != field_base->offset64) {
          return "offset types differ for field: " + qualified_field_name;
        }
      } else {
        // Doesn't have to exist, deleting fields is fine.
        // But we should check if there is a field that has the same offset
        // but is incompatible (in the case of field renaming).
        for (auto fbit = struct_def_base->fields.vec.begin();
             fbit != struct_def_base->fields.vec.end(); ++fbit) {
          field_base = *fbit;
          if (field.value.offset == field_base->value.offset) {
            renamed_fields.insert(field_base);
            if (!EqualByName(field.value.type, field_base->value.type)) {
              const auto qualified_field_base =
                  qualified_name + "." + field_base->name;
              return "field renamed to different type: " +
                     qualified_field_name + " (renamed from " +
                     qualified_field_base + ")";
            }
            break;
          }
        }
      }
    }
    // deletion of trailing fields are not allowed
    for (auto fit = struct_def_base->fields.vec.begin();
         fit != struct_def_base->fields.vec.end(); ++fit) {
      auto &field_base = **fit;
      // not a renamed field
      if (renamed_fields.find(&field_base) == renamed_fields.end()) {
        auto field = struct_def.fields.Lookup(field_base.name);
        if (!field) {
          return "field deleted: " + qualified_name + "." + field_base.name;
        }
      }
    }
  }

  for (auto eit = enums_.vec.begin(); eit != enums_.vec.end(); ++eit) {
    auto &enum_def = **eit;
    auto qualified_name =
        enum_def.defined_namespace->GetFullyQualifiedName(enum_def.name);
    auto enum_def_base = base.enums_.Lookup(qualified_name);
    if (!enum_def_base) continue;
    for (auto evit = enum_def.Vals().begin(); evit != enum_def.Vals().end();
         ++evit) {
      auto &enum_val = **evit;
      auto enum_val_base = enum_def_base->Lookup(enum_val.name);
      if (enum_val_base) {
        if (enum_val != *enum_val_base)
          return "values differ for enum: " + enum_val.name;
      }
    }
    // Check underlying type changes
    if (enum_def_base->underlying_type.base_type != enum_def.underlying_type.base_type) {
      return "underlying type differ for " + std::string(enum_def.is_union ? "union: " : "enum: ") + qualified_name;
    }
  }
  return "";
}